

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateProfiledNewScFloatArrayFastPath
          (Lowerer *this,Instr *instr,ArrayCallSiteInfo *arrayInfo,intptr_t arrayInfoAddr,
          intptr_t weakFuncRef)

{
  Func *func;
  uint32 *puVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  AddrOpnd *pAVar3;
  LabelInstr *helperLabel;
  RegOpnd *pRVar4;
  RegOpnd *baseOpnd;
  AddrOpnd *value;
  IndirOpnd *src;
  Opnd *value_00;
  LabelInstr *target;
  ArrayCallSiteInfo *arrayInfo_00;
  int iVar5;
  int offset;
  undefined1 local_a0 [8];
  AutoReuseOpnd autoReuseHeadOpnd;
  AutoReuseOpnd autoReuseDstElementsOpnd;
  uint32 local_44;
  Func *pFStack_40;
  uint32 size;
  bool local_31 [8];
  bool isHeadSegmentZeroed;
  
  pFStack_40 = (Func *)weakFuncRef;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01441eb0,ArrayLiteralFastPathPhase,sourceContextId,functionId);
  if ((!bVar2) && (DAT_0143bfb9 == '\0')) {
    bVar2 = Js::ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    if (bVar2) {
      pAVar3 = IR::Opnd::AsAddrOpnd(instr->m_src1);
      if (pAVar3->addrOpndKind == AddrOpndKindDynamicAuxBufferRef) {
        func = this->m_func;
        helperLabel = IR::LabelInstr::New(Label,func,true);
        GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                  (this,instr,arrayInfo_00,arrayInfoAddr,helperLabel);
        pAVar3 = IR::Opnd::AsAddrOpnd(instr->m_src1);
        puVar1 = (uint32 *)pAVar3->m_metadata;
        local_44 = *puVar1;
        pRVar4 = IR::Opnd::AsRegOpnd(instr->m_dst);
        baseOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>
                             (this,instr,&local_44,arrayInfo,local_31);
        IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_a0,&baseOpnd->super_Opnd,func,true);
        value = IR::AddrOpnd::New((intptr_t)pFStack_40,AddrOpndKindDynamicFunctionBodyWeakRef,
                                  this->m_func,false,(Var)0x0);
        GenerateMemInit(this,pRVar4,0x38,&value->super_Opnd,instr,false);
        pRVar4 = IR::RegOpnd::New(TyUint64,func);
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete,&pRVar4->super_Opnd,func,true);
        pAVar3 = IR::AddrOpnd::New((long)pAVar3->m_address + 8,AddrOpndKindDynamicMisc,func,false,
                                   (Var)0x0);
        src = IR::IndirOpnd::New(baseOpnd,0x18,TyUint64,func,false);
        InsertLea(pRVar4,&src->super_Opnd,instr);
        GenerateMemCopy(this,&pRVar4->super_Opnd,&pAVar3->super_Opnd,*puVar1 << 3,instr);
        iVar5 = local_44 - *puVar1;
        offset = *puVar1 * 8 + 0x18;
        pFStack_40 = func;
        while (bVar2 = iVar5 != 0, iVar5 = iVar5 + -1, bVar2) {
          value_00 = GetMissingItemOpndForAssignment(TyFloat64,this->m_func);
          GenerateMemInit(this,baseOpnd,offset,value_00,instr,false);
          offset = offset + 8;
        }
        target = IR::LabelInstr::New(Label,pFStack_40,false);
        InsertBranch(Br,target,instr);
        IR::Instr::InsertBefore(instr,&helperLabel->super_Instr);
        IR::Instr::InsertAfter(instr,&target->super_Instr);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseHeadOpnd.autoDelete);
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a0);
      }
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateProfiledNewScFloatArrayFastPath(IR::Instr *instr, Js::ArrayCallSiteInfo * arrayInfo, intptr_t arrayInfoAddr, intptr_t weakFuncRef)
{
    if (PHASE_OFF(Js::ArrayLiteralFastPathPhase, m_func) || CONFIG_FLAG(ForceES5Array))
    {
        return;
    }

    if (!arrayInfo->IsNativeFloatArray())
    {
        return;
    }

    if (instr->GetSrc1()->AsAddrOpnd()->GetAddrOpndKind() != IR::AddrOpndKindDynamicAuxBufferRef)
    {
        return;
    }

    Func * func = this->m_func;
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);

    // If the array info hasn't mark as not int array yet, go to the helper and mark it.
    // It really is just for assert purpose in JavascriptNativeFloatArray::ToVarArray
    GenerateArrayInfoIsNativeFloatAndNotIntArrayTest(instr, arrayInfo, arrayInfoAddr, helperLabel);

    IR::AddrOpnd * elementsOpnd = instr->GetSrc1()->AsAddrOpnd();
    Js::AuxArray<double> * doubles = (Js::AuxArray<double> *)elementsOpnd->m_metadata;
    uint32 size = doubles->count;

    // Generate code as in JavascriptArray::NewLiteral
    bool isHeadSegmentZeroed;
    IR::RegOpnd * dstOpnd = instr->GetDst()->AsRegOpnd();
    Assert(Js::JavascriptNativeFloatArray::GetOffsetOfArrayFlags() + sizeof(uint16) == Js::JavascriptNativeFloatArray::GetOffsetOfArrayCallSiteIndex());
    IR::RegOpnd * headOpnd = GenerateArrayLiteralsAlloc<Js::JavascriptNativeFloatArray>(instr, &size, arrayInfo, &isHeadSegmentZeroed);
    const IR::AutoReuseOpnd autoReuseHeadOpnd(headOpnd, func);

    GenerateMemInit(dstOpnd, Js::JavascriptNativeFloatArray::GetOffsetOfWeakFuncRef(), IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func), instr, isHeadSegmentZeroed);

    // Initialize the elements

    IR::RegOpnd * dstElementsOpnd = IR::RegOpnd::New(TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseDstElementsOpnd(dstElementsOpnd, func);
    IR::Opnd * srcOpnd = IR::AddrOpnd::New((intptr_t)elementsOpnd->m_address + Js::AuxArray<double>::OffsetOfElements(), IR::AddrOpndKindDynamicMisc, func);
    InsertLea(dstElementsOpnd, IR::IndirOpnd::New(headOpnd, sizeof(Js::SparseArraySegmentBase), TyMachPtr, func), instr);
    GenerateMemCopy(dstElementsOpnd, srcOpnd, doubles->count * sizeof(double), instr);

    // Js::JavascriptArray::MissingItem is a Var, so it may be 32-bit or 64 bit.
    uint const offsetStart = sizeof(Js::SparseArraySegmentBase) + doubles->count * sizeof(double);
    uint const missingItem = (size - doubles->count);
    for (uint i = 0; i < missingItem; i++)
    {
        GenerateMemInit(headOpnd, offsetStart + i * sizeof(double),
            GetMissingItemOpndForAssignment(TyFloat64, m_func), instr, isHeadSegmentZeroed);
    }
    // Skip pass the helper call
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);

    instr->InsertAfter(doneLabel);
}